

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::printLine(string *filename)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  reference __lhs;
  reference pvVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  CodeLine *t;
  iterator __end1;
  iterator __begin1;
  vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_> *__range1;
  int lm;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  freopen(pcVar3,"w",_stdout);
  __range1._4_4_ = -1;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)SDT::errVec_abi_cxx11_);
  if (bVar1) {
    __end1 = std::vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_>::begin
                       ((vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_> *)SDT::codes);
    t = (CodeLine *)
        std::vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_>::end
                  ((vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_> *)SDT::codes);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SDT::CodeLine_*,_std::vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_>_>
                                       *)&t), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<SDT::CodeLine_*,_std::vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_>_>
              ::operator*(&__end1);
      __range1._4_4_ = __range1._4_4_ + 1;
      if (__range1._4_4_ != 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,__range1._4_4_);
        poVar6 = std::operator<<(poVar6,":(");
        poVar6 = std::operator<<(poVar6,(string *)__lhs);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
        std::operator<<(poVar6,")");
        bVar1 = std::operator==(&__lhs->op,"j<");
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
          poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
          poVar6 = std::operator<<(poVar6,"<");
          poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
          poVar6 = std::operator<<(poVar6," goto ");
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar3);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,(long)-iVar2);
          std::ostream::operator<<(poVar6,*pvVar4);
        }
        else {
          bVar1 = std::operator==(&__lhs->op,"j<=");
          if (bVar1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
            poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
            poVar6 = std::operator<<(poVar6,"<=");
            poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
            poVar6 = std::operator<<(poVar6," goto ");
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = atoi(pcVar3);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,(long)-iVar2);
            std::ostream::operator<<(poVar6,*pvVar4);
          }
          else {
            bVar1 = std::operator==(&__lhs->op,"j>");
            if (bVar1) {
              poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
              poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
              poVar6 = std::operator<<(poVar6,">");
              poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
              poVar6 = std::operator<<(poVar6," goto ");
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = atoi(pcVar3);
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,(long)-iVar2);
              std::ostream::operator<<(poVar6,*pvVar4);
            }
            else {
              bVar1 = std::operator==(&__lhs->op,"j>=");
              if (bVar1) {
                poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
                poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                poVar6 = std::operator<<(poVar6,">=");
                poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
                poVar6 = std::operator<<(poVar6," goto ");
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = atoi(pcVar3);
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,(long)-iVar2
                                   );
                std::ostream::operator<<(poVar6,*pvVar4);
              }
              else {
                bVar1 = std::operator==(&__lhs->op,"je");
                if (bVar1) {
                  poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
                  poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                  poVar6 = std::operator<<(poVar6,"==");
                  poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
                  poVar6 = std::operator<<(poVar6," goto ");
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  iVar2 = atoi(pcVar3);
                  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,
                                      (long)-iVar2);
                  std::ostream::operator<<(poVar6,*pvVar4);
                }
                else {
                  bVar1 = std::operator==(&__lhs->op,"jne");
                  if (bVar1) {
                    poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
                    poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                    poVar6 = std::operator<<(poVar6,"!=");
                    poVar6 = std::operator<<(poVar6,(string *)&__lhs->t2);
                    poVar6 = std::operator<<(poVar6," goto ");
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    iVar2 = atoi(pcVar3);
                    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,
                                        (long)-iVar2);
                    std::ostream::operator<<(poVar6,*pvVar4);
                  }
                  else {
                    bVar1 = std::operator==(&__lhs->op,"jnz");
                    if (bVar1) {
                      poVar6 = std::operator<<((ostream *)&std::cout,"        if ");
                      poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                      poVar6 = std::operator<<(poVar6," not bitwise-zero");
                      poVar6 = std::operator<<(poVar6," goto ");
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      iVar2 = atoi(pcVar3);
                      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,
                                          (long)-iVar2);
                      std::ostream::operator<<(poVar6,*pvVar4);
                    }
                    else {
                      bVar1 = std::operator==(&__lhs->op,"j");
                      if (bVar1) {
                        poVar6 = std::operator<<((ostream *)&std::cout,"         goto ");
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        iVar2 = atoi(pcVar3);
                        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                           ((vector<int,_std::allocator<int>_> *)SDT::tempLabel,
                                            (long)-iVar2);
                        std::ostream::operator<<(poVar6,*pvVar4);
                      }
                      else {
                        bVar1 = std::operator==(&__lhs->op,"=");
                        if (bVar1) {
                          poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                          poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
                          poVar6 = std::operator<<(poVar6,"=");
                          std::operator<<(poVar6,(string *)&__lhs->t1);
                        }
                        else {
                          bVar1 = std::operator==(&__lhs->op,"ret");
                          if (bVar1) {
                            poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                            std::operator<<(poVar6,"return");
                          }
                          else {
                            bVar1 = std::operator==(&__lhs->op,"*");
                            if ((((bVar1) || (bVar1 = std::operator==(&__lhs->op,"/"), bVar1)) ||
                                (bVar1 = std::operator==(&__lhs->op,"+"), bVar1)) ||
                               (((bVar1 = std::operator==(&__lhs->op,"-"), bVar1 ||
                                 (bVar1 = std::operator==(&__lhs->op,"OR"), bVar1)) ||
                                (bVar1 = std::operator==(&__lhs->op,"AND"), bVar1)))) {
                              poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                              poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
                              poVar6 = std::operator<<(poVar6,"=");
                              poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                              poVar6 = std::operator<<(poVar6," ");
                              poVar6 = std::operator<<(poVar6,(string *)__lhs);
                              poVar6 = std::operator<<(poVar6," ");
                              std::operator<<(poVar6,(string *)&__lhs->t2);
                            }
                            else {
                              bVar1 = std::operator==(&__lhs->op,"neg");
                              if (bVar1) {
                                poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                                poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
                                poVar6 = std::operator<<(poVar6,"= -");
                                std::operator<<(poVar6,(string *)&__lhs->t1);
                              }
                              else {
                                bVar1 = std::operator==(&__lhs->op,"not");
                                if (bVar1) {
                                  poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                                  poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
                                  poVar6 = std::operator<<(poVar6,"= !");
                                  std::operator<<(poVar6,(string *)&__lhs->t1);
                                }
                                else {
                                  bVar1 = std::operator==(&__lhs->op,"param");
                                  if (bVar1) {
                                    poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                                    poVar6 = std::operator<<(poVar6,"param ");
                                    std::operator<<(poVar6,(string *)&__lhs->res);
                                  }
                                  else {
                                    bVar1 = std::operator==(&__lhs->op,"call");
                                    if (bVar1) {
                                      poVar6 = std::operator<<((ostream *)&std::cout,"         ");
                                      poVar6 = std::operator<<(poVar6,"call function ");
                                      poVar6 = std::operator<<(poVar6,(string *)&__lhs->res);
                                      poVar6 = std::operator<<(poVar6,"(with ");
                                      poVar6 = std::operator<<(poVar6,(string *)&__lhs->t1);
                                      poVar6 = std::operator<<(poVar6," params,goto ");
                                      pmVar5 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                               ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)SDT::funcs_abi_cxx11_,&__lhs->res);
                                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pmVar5);
                                      std::operator<<(poVar6,")");
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      __gnu_cxx::
      __normal_iterator<SDT::CodeLine_*,_std::vector<SDT::CodeLine,_std::allocator<SDT::CodeLine>_>_>
      ::operator++(&__end1);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,__range1._4_4_ + 1);
    std::operator<<(poVar6,":");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Compile Error!");
  }
  return;
}

Assistant:

void printLine(string filename){
        freopen(filename.c_str() , "w" , stdout);
        int lm = -1;
        if(!SDT::errVec.empty()){
            cout<<"Compile Error!";
            return;
        }
        for(auto &t:SDT::codes){
            lm++;if(lm==0)continue;
            cout<<"line "<<lm<<":("<<t.op<<","<<t.t1<<","<<t.t2<<","<<t.res<<")";
            if(t.op=="j<"){
                cout<<"        if "<<t.t1<<"<"<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="j<=") {
                cout<<"        if "<<t.t1<<"<="<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="j>") {
                cout<<"        if "<<t.t1<<">"<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="j>=") {
                cout<<"        if "<<t.t1<<">="<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="je") {
                cout<<"        if "<<t.t1<<"=="<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="jne") {
                cout<<"        if "<<t.t1<<"!="<<t.t2<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="jnz") {
                cout<<"        if "<<t.t1<<" not bitwise-zero"<<" goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="j"){
                cout<<"         goto "<<SDT::tempLabel[-atoi(t.res.c_str())];
            }else if(t.op=="="){
                cout<<"         "<<t.res<<"="<<t.t1;
            }else if(t.op=="ret"){
                cout<<"         "<<"return";
            }else if(t.op=="*"||t.op=="/"||t.op=="+"||t.op=="-"||t.op=="OR"||t.op=="AND"){
                cout<<"         "<<t.res<<"="<<t.t1<<" "<<t.op<<" "<<t.t2;
            }else if(t.op=="neg"){
                cout<<"         "<<t.res<<"= -"<<t.t1;
            }else if(t.op=="not"){
                cout<<"         "<<t.res<<"= !"<<t.t1;
            }else if(t.op=="param"){
                cout<<"         "<<"param "<<t.res;
            }else if(t.op=="call"){
                cout<<"         "<<"call function "<<t.res<<"(with "<<t.t1<<" params,goto "<<SDT::funcs[t.res]<<")";
            }
            cout<<endl;
        }
        cout<<"line "<<++lm<<":";
        //fclose(stdout);
    }